

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O3

int lfilter(lua_State *L)

{
  ushort uVar1;
  int *piVar2;
  lua_Integer lVar3;
  queue *q;
  uncomplete *puVar4;
  void *pvVar5;
  uint uVar6;
  ushort *s;
  int iVar7;
  ulong uVar8;
  byte *buffer;
  ushort *puVar9;
  uint uVar10;
  int iVar11;
  int size;
  
  piVar2 = (int *)lua_touserdata(L,2);
  lVar3 = luaL_checkinteger(L,3);
  puVar9 = *(ushort **)(piVar2 + 4);
  s = (ushort *)(piVar2 + 6);
  if (puVar9 != (ushort *)0x0) {
    s = puVar9;
  }
  iVar11 = 1;
  lua_settop(L,1);
  if (6 < *piVar2 - 1U) {
    return 1;
  }
  uVar10 = -(uint)(puVar9 != (ushort *)0x0) | (int)lVar3 - 0x18U;
  switch(*piVar2) {
  case 1:
    if (uVar10 != 0xffffffff) {
      __assert_fail("size == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-netpack.c"
                    ,0x160,"int lfilter(lua_State *)");
    }
    uVar10 = piVar2[1];
    iVar11 = piVar2[2];
    q = (queue *)lua_touserdata(L,1);
    puVar4 = find_uncomplete(q,uVar10);
    if (puVar4 == (uncomplete *)0x0) {
      if (iVar11 == 1) {
        puVar4 = save_uncomplete(L,uVar10);
        puVar4->read = -1;
        puVar4->header = (uint)(byte)*s;
      }
      else {
        uVar1 = *s << 8 | *s >> 8;
        puVar9 = s + 1;
        iVar7 = (int)((long)iVar11 - 2U);
        size = iVar7 - (uint)uVar1;
        uVar6 = (uint)uVar1;
        if ((int)(uint)uVar1 <= iVar7) {
          if (size != 0) {
            push_data(L,uVar10,puVar9,uVar6,1);
            buffer = (byte *)((ulong)uVar6 + (long)puVar9);
            goto LAB_00120234;
          }
          lua_pushvalue(L,-0xf4629);
          lua_pushinteger(L,(long)(int)uVar10);
          uVar8 = (ulong)(uint)uVar1;
          pvVar5 = malloc(uVar8);
          memcpy(pvVar5,puVar9,uVar8);
          lua_pushlightuserdata(L,pvVar5);
          lua_pushinteger(L,uVar8);
          goto LAB_0012020c;
        }
        puVar4 = save_uncomplete(L,uVar10);
        puVar4->read = iVar7;
        (puVar4->pack).size = (uint)uVar1;
        pvVar5 = malloc((ulong)uVar6);
        (puVar4->pack).buffer = pvVar5;
        memcpy(pvVar5,puVar9,(long)iVar11 - 2U);
      }
LAB_0012017a:
      iVar11 = 1;
    }
    else {
      uVar6 = puVar4->read;
      if ((int)uVar6 < 0) {
        if (uVar6 != 0xffffffff) {
          __assert_fail("uc->read == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-netpack.c"
                        ,0xe9,"int filter_data_(lua_State *, int, uint8_t *, int)");
        }
        uVar8 = (long)(puVar4->header << 8) | (ulong)(byte)*s;
        puVar9 = (ushort *)((long)s + 1);
        iVar11 = iVar11 + -1;
        (puVar4->pack).size = (int)uVar8;
        pvVar5 = malloc(uVar8);
        (puVar4->pack).buffer = pvVar5;
        puVar4->read = 0;
        uVar6 = 0;
      }
      else {
        uVar8 = (ulong)(uint)(puVar4->pack).size;
        pvVar5 = (puVar4->pack).buffer;
        puVar9 = s;
      }
      iVar7 = (int)uVar8 - uVar6;
      if (iVar11 < iVar7) {
        memcpy((void *)((ulong)uVar6 + (long)pvVar5),puVar9,(long)iVar11);
        puVar4->read = puVar4->read + iVar11;
        uVar10 = ((int)uVar10 >> 0x18) + (uVar10 >> 0xc) + uVar10 & 0xfff;
        puVar4->next = q->hash[uVar10];
        q->hash[uVar10] = puVar4;
        goto LAB_0012017a;
      }
      memcpy((void *)((ulong)uVar6 + (long)pvVar5),puVar9,(long)iVar7);
      size = iVar11 - iVar7;
      if (size == 0) {
        lua_pushvalue(L,-0xf4629);
        lua_pushinteger(L,(long)(int)uVar10);
        lua_pushlightuserdata(L,(puVar4->pack).buffer);
        lua_pushinteger(L,(long)(puVar4->pack).size);
        free(puVar4);
LAB_0012020c:
        iVar11 = 5;
      }
      else {
        buffer = (byte *)((long)puVar9 + (long)iVar7);
        push_data(L,uVar10,(puVar4->pack).buffer,(puVar4->pack).size,0);
        free(puVar4);
LAB_00120234:
        push_more(L,uVar10,buffer,size);
        lua_pushvalue(L,-0xf462a);
        iVar11 = 2;
      }
    }
    free(s);
    break;
  case 3:
    close_uncomplete(L,piVar2[1]);
    lua_pushvalue(L,-0xf462d);
    lua_pushinteger(L,(long)piVar2[1]);
    iVar11 = 3;
    break;
  case 4:
    lua_pushvalue(L,-0xf462c);
    iVar11 = piVar2[2];
    goto LAB_0011ffd1;
  case 5:
    close_uncomplete(L,piVar2[1]);
    lua_pushvalue(L,-0xf462b);
    iVar11 = piVar2[1];
LAB_0011ffd1:
    lua_pushinteger(L,(long)iVar11);
    lua_pushlstring(L,(char *)s,(long)(int)uVar10);
LAB_0012000e:
    iVar11 = 4;
    break;
  case 7:
    lua_pushvalue(L,-0xf462e);
    lua_pushinteger(L,(long)piVar2[1]);
    lua_pushinteger(L,(long)piVar2[2]);
    goto LAB_0012000e;
  }
  return iVar11;
}

Assistant:

static int
lfilter(lua_State *L) {
	struct skynet_socket_message *message = lua_touserdata(L,2);
	int size = luaL_checkinteger(L,3);
	char * buffer = message->buffer;
	if (buffer == NULL) {
		buffer = (char *)(message+1);
		size -= sizeof(*message);
	} else {
		size = -1;
	}

	lua_settop(L, 1);

	switch(message->type) {
	case SKYNET_SOCKET_TYPE_DATA:
		// ignore listen id (message->id)
		assert(size == -1);	// never padding string
		return filter_data(L, message->id, (uint8_t *)buffer, message->ud);
	case SKYNET_SOCKET_TYPE_CONNECT:
		// ignore listen fd connect
		return 1;
	case SKYNET_SOCKET_TYPE_CLOSE:
		// no more data in fd (message->id)
		close_uncomplete(L, message->id);
		lua_pushvalue(L, lua_upvalueindex(TYPE_CLOSE));
		lua_pushinteger(L, message->id);
		return 3;
	case SKYNET_SOCKET_TYPE_ACCEPT:
		lua_pushvalue(L, lua_upvalueindex(TYPE_OPEN));
		// ignore listen id (message->id);
		lua_pushinteger(L, message->ud);
		pushstring(L, buffer, size);
		return 4;
	case SKYNET_SOCKET_TYPE_ERROR:
		// no more data in fd (message->id)
		close_uncomplete(L, message->id);
		lua_pushvalue(L, lua_upvalueindex(TYPE_ERROR));
		lua_pushinteger(L, message->id);
		pushstring(L, buffer, size);
		return 4;
	case SKYNET_SOCKET_TYPE_WARNING:
		lua_pushvalue(L, lua_upvalueindex(TYPE_WARNING));
		lua_pushinteger(L, message->id);
		lua_pushinteger(L, message->ud);
		return 4;
	default:
		// never get here
		return 1;
	}
}